

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.hpp
# Opt level: O0

offset_t __thiscall lattice::supercell::lcord2offset(supercell *this,size_t lc)

{
  long lVar1;
  CoeffReturnType plVar2;
  long lVar3;
  Scalar *pSVar4;
  ulong in_RDX;
  ulong extraout_RDX;
  ulong uVar5;
  ulong *in_RSI;
  long *in_RDI;
  offset_t oVar6;
  size_t m;
  offset_t *c;
  Index in_stack_ffffffffffffff58;
  DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_0> *in_stack_ffffffffffffff60;
  unsigned_long *in_stack_ffffffffffffff68;
  Matrix<long,__1,_1,_0,__1,_1> *in_stack_ffffffffffffff70;
  undefined8 local_28;
  undefined8 local_18;
  
  Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  uVar5 = extraout_RDX;
  local_18 = in_RDX;
  for (local_28 = 0; local_28 < *in_RSI; local_28 = local_28 + 1) {
    plVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_0>::operator()
                       (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    lVar3 = *plVar2;
    plVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_0>::operator()
                       (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    lVar1 = *plVar2;
    plVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_0>::operator()
                       (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    lVar3 = local_18 % (ulong)(lVar3 - lVar1) + *plVar2;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    *pSVar4 = lVar3;
    plVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_0>::operator()
                       (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff58 = *plVar2;
    in_stack_ffffffffffffff60 =
         (DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_0> *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_0>::operator()
                   (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    uVar5 = local_18 % (ulong)(in_stack_ffffffffffffff58 - *(long *)in_stack_ffffffffffffff60);
    local_18 = local_18 / (ulong)(in_stack_ffffffffffffff58 - *(long *)in_stack_ffffffffffffff60);
  }
  oVar6.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_rows = uVar5;
  oVar6.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.m_data = in_RDI;
  return (offset_t)oVar6.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

offset_t lcord2offset(std::size_t lc) const {
    offset_t c(dim_);
    for (std::size_t m = 0; m < dim_; ++m) {
      c(m) = (lc % (nmax_(m) - nmin_(m))) + nmin_(m);
      lc /= (nmax_(m) - nmin_(m));
    }
    return c;
  }